

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HashTable.h
# Opt level: O2

BVSparse<Memory::JitArenaAllocator> * __thiscall
HashTable<BVSparse<Memory::JitArenaAllocator>_*,_Memory::ArenaAllocator>::GetAndClear
          (HashTable<BVSparse<Memory::JitArenaAllocator>_*,_Memory::ArenaAllocator> *this,int value)

{
  DictionaryStats *this_00;
  bool bVar1;
  Type *pTVar2;
  bool bVar3;
  BVSparse<Memory::JitArenaAllocator> *pBVar4;
  undefined1 local_48 [8];
  EditingIterator iter;
  
  local_48 = (undefined1  [8])(this->table + (ulong)(uint)value % (ulong)this->tableSize);
  iter.super_Iterator.current = (NodeBase *)0x0;
  iter.super_Iterator.list =
       (SListBase<Bucket<BVSparse<Memory::JitArenaAllocator>_*>,_Memory::ArenaAllocator,_RealCount>
        *)local_48;
  bVar1 = true;
  do {
    bVar3 = bVar1;
    bVar1 = SListBase<Bucket<BVSparse<Memory::JitArenaAllocator>_*>,_Memory::ArenaAllocator,_RealCount>
            ::EditingIterator::Next((EditingIterator *)local_48);
    if (!bVar1) {
      return (BVSparse<Memory::JitArenaAllocator> *)0x0;
    }
    pTVar2 = SListBase<Bucket<BVSparse<Memory::JitArenaAllocator>_*>,_Memory::ArenaAllocator,_RealCount>
             ::Iterator::Data((Iterator *)local_48);
    bVar1 = false;
  } while (value < pTVar2->value);
  if (pTVar2->value == value) {
    pBVar4 = pTVar2->element;
    SListBase<Bucket<BVSparse<Memory::JitArenaAllocator>_*>,_Memory::ArenaAllocator,_RealCount>::
    EditingIterator::RemoveCurrent((EditingIterator *)local_48,this->alloc);
    this_00 = this->stats;
    if (this_00 != (DictionaryStats *)0x0) {
      if (bVar3) {
        bVar1 = SListBase<Bucket<BVSparse<Memory::JitArenaAllocator>_*>,_Memory::ArenaAllocator,_RealCount>
                ::EditingIterator::Next((EditingIterator *)local_48);
        bVar1 = !bVar1;
      }
      else {
        bVar1 = false;
      }
      DictionaryStats::Remove(this_00,bVar1);
    }
  }
  else {
    pBVar4 = (BVSparse<Memory::JitArenaAllocator> *)0x0;
  }
  return pBVar4;
}

Assistant:

T GetAndClear(int value)
    {
        SListBase<Bucket<T>> * list = &this->table[this->Hash(value)];

#if PROFILE_DICTIONARY
        bool first = true;
#endif
        // Assumes sorted lists
        FOREACH_SLISTBASE_ENTRY_EDITING(Bucket<T>, bucket, list, iter)
        {
            if (bucket.value <= value)
            {
                if (bucket.value == value)
                {
                    T retVal = bucket.element;
                    iter.RemoveCurrent(this->alloc);
#if PROFILE_DICTIONARY
                    if (stats)
                        stats->Remove(first && !(iter.Next()));
#endif
                    return retVal;
                }
                break;
            }
#if PROFILE_DICTIONARY
        first = false;
#endif
        } NEXT_SLISTBASE_ENTRY_EDITING;
        return T();
    }